

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

float rsg::AssignOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  VariableManager *pVVar2;
  bool bVar3;
  int iVar4;
  pointer ppVVar5;
  float fVar6;
  IsWritableIntersectingEntry local_48;
  
  if ((valueRange.m_type)->m_baseType != TYPE_VOID) {
    bVar3 = anon_unknown_0::canAllocateVariable(state,valueRange.m_type);
    if (!bVar3) {
      pVVar2 = state->m_varManager;
      local_48.m_valueRange.m_max = valueRange.m_max;
      local_48.m_valueRange.m_type = valueRange.m_type;
      local_48.m_valueRange.m_min = valueRange.m_min;
      ppVVar5 = (pVVar2->m_entryCache).
                super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        if (ppVVar5 ==
            (pVVar2->m_entryCache).
            super__Vector_base<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_00941930;
        bVar3 = anon_unknown_0::IsWritableIntersectingEntry::operator()(&local_48,*ppVVar5);
        ppVVar5 = ppVVar5 + 1;
      } while (!bVar3);
    }
    if ((valueRange.m_type)->m_baseType != TYPE_VOID) {
      iVar1 = state->m_expressionDepth;
      iVar4 = getTypeConstructorDepth(valueRange.m_type);
      if (state->m_shaderParams->maxExpressionDepth <= iVar4 + iVar1 + 1) {
        return 0.0;
      }
      if ((valueRange.m_type)->m_baseType != TYPE_VOID) goto LAB_0094192a;
    }
  }
  bVar3 = VariableManager::hasEntry<rsg::IsWritableEntry>(state->m_varManager);
  if ((!bVar3) &&
     (state->m_shaderParams->maxCombinedVariableScalars <=
      state->m_varManager->m_numAllocatedScalars)) {
    return 0.0;
  }
LAB_0094192a:
  if (state->m_expressionDepth == 0) {
    fVar6 = 4.0;
  }
  else {
LAB_00941930:
    fVar6 = 0.0;
  }
  return fVar6;
}

Assistant:

float AssignOp::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (!valueRange.getType().isVoid() &&
		!canAllocateVariable(state, valueRange.getType()) &&
		!state.getVariableManager().hasEntry(IsWritableIntersectingEntry(valueRange)))
		return 0.0f; // Would require creating a new variable

	if (!valueRange.getType().isVoid() && state.getExpressionDepth() + getTypeConstructorDepth(valueRange.getType()) + 1 >= state.getShaderParameters().maxExpressionDepth)
		return 0.0f;

	if (valueRange.getType().isVoid() &&
		!state.getVariableManager().hasEntry<IsWritableEntry>() &&
		state.getVariableManager().getNumAllocatedScalars() >= state.getShaderParameters().maxCombinedVariableScalars)
		return 0.0f; // Can not allocate a new entry

	if (state.getExpressionDepth() == 0)
		return 4.0f;
	else
		return 0.0f; // \todo [pyry] Fix assign ops
}